

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spng.c
# Opt level: O0

int check_exif(spng_exif *exif)

{
  uint8_t exif_be [4];
  uint8_t exif_le [4];
  spng_exif *exif_local;
  
  if (exif == (spng_exif *)0x0) {
    exif_local._4_4_ = 1;
  }
  else if (exif->data == (char *)0x0) {
    exif_local._4_4_ = 1;
  }
  else if (exif->length < 4) {
    exif_local._4_4_ = 0x11;
  }
  else if (exif->length < 0x80000000) {
    if ((*(int *)exif->data == 0x2a4949) || (*(int *)exif->data == 0x2a004d4d)) {
      exif_local._4_4_ = 0;
    }
    else {
      exif_local._4_4_ = 1;
    }
  }
  else {
    exif_local._4_4_ = 0x4f;
  }
  return exif_local._4_4_;
}

Assistant:

static int check_exif(const struct spng_exif *exif)
{
    if(exif == NULL) return 1;
    if(exif->data == NULL) return 1;

    if(exif->length < 4) return SPNG_ECHUNK_SIZE;
    if(exif->length > spng_u32max) return SPNG_ECHUNK_STDLEN;

    const uint8_t exif_le[4] = { 73, 73, 42, 0 };
    const uint8_t exif_be[4] = { 77, 77, 0, 42 };

    if(memcmp(exif->data, exif_le, 4) && memcmp(exif->data, exif_be, 4)) return 1;

    return 0;
}